

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_panel.cpp
# Opt level: O2

int max_item_height_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value_Type AVar2;
  int iVar3;
  Am_Value *pAVar4;
  int iVar5;
  Am_Slot_Key key;
  Am_Object item;
  Am_Value_List components;
  
  Am_Value_List::Am_Value_List(&components);
  pAVar4 = Am_Object::Get(self,0x82,0);
  Am_Value_List::operator=(&components,pAVar4);
  Am_Value_List::Start(&components);
  iVar5 = 0;
  while( true ) {
    bVar1 = Am_Value_List::Last(&components);
    if (bVar1) break;
    item.data = (Am_Object_Data *)0x0;
    pAVar4 = Am_Value_List::Get(&components);
    Am_Object::operator=(&item,pAVar4);
    pAVar4 = Am_Object::Get(&item,0x69,0);
    bVar1 = Am_Value::operator_cast_to_bool(pAVar4);
    if (bVar1) {
      AVar2 = Am_Object::Get_Slot_Type(&item,0x1d1,0);
      key = 0x1d1;
      if (AVar2 != 2) {
        key = 0x67;
      }
      pAVar4 = Am_Object::Get(&item,key,0);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      if (iVar5 < iVar3) {
        iVar5 = iVar3;
      }
    }
    Am_Object::~Am_Object(&item);
    Am_Value_List::Next(&components);
  }
  Am_Value_List::~Am_Value_List(&components);
  return iVar5;
}

Assistant:

Am_Define_Formula(int, max_item_height)
{
  // based on Am_map_width in opal.cc
  // finds width of widest visible item

  Am_Value_List components;
  components = self.Get(Am_GRAPHICAL_PARTS);
  int height = 0;
  for (components.Start(); !components.Last(); components.Next()) {
    Am_Object item;
    item = components.Get();
    if ((bool)item.Get(Am_VISIBLE)) {
      int item_height;
      if (item.Get_Slot_Type(Am_REAL_HEIGHT) == Am_INT)
        item_height = item.Get(Am_REAL_HEIGHT);
      else
        item_height = item.Get(Am_HEIGHT);
      if (item_height > height)
        height = item_height;
    }
  }
  return height;
}